

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resampler.cpp
# Opt level: O0

uint32_t fill_with_sine(float *buf,uint32_t rate,uint32_t channels,uint32_t frames,
                       uint32_t initial_phase)

{
  ulong uVar1;
  uint in_ECX;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  uint in_R8D;
  double dVar2;
  uint32_t j;
  float p;
  uint32_t i;
  uint32_t offset;
  undefined4 local_28;
  undefined4 local_20;
  undefined4 local_1c;
  undefined4 local_18;
  
  local_1c = 0;
  local_18 = in_R8D;
  for (local_20 = 0; local_20 < in_ECX; local_20 = local_20 + 1) {
    uVar1 = (ulong)local_18;
    local_18 = local_18 + 1;
    for (local_28 = 0; local_28 < in_EDX; local_28 = local_28 + 1) {
      dVar2 = sin((double)((float)uVar1 / (float)in_ESI) * 2764.6016120910645);
      *(float *)(in_RDI + (ulong)local_1c * 4) = (float)(dVar2 * 0.5);
      local_1c = local_1c + 1;
    }
  }
  return local_18;
}

Assistant:

uint32_t fill_with_sine(float * buf, uint32_t rate, uint32_t channels,
                        uint32_t frames, uint32_t initial_phase)
{
  uint32_t offset = 0;
  for (uint32_t i = 0; i < frames; i++) {
    float  p = initial_phase++ / static_cast<float>(rate);
    for (uint32_t j = 0; j < channels; j++) {
      buf[offset++] = 0.5 * sin(440. * 2 * PI * p);
    }
  }
  return initial_phase;
}